

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::add_undo_rec(CVmObjDict *this,vm_obj_id_t self,dict_undo_rec *rec)

{
  int iVar1;
  void *in_RDX;
  undefined4 in_ESI;
  vm_val_t val;
  vm_val_t *in_stack_ffffffffffffffd8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  vm_val_t::set_empty((vm_val_t *)&stack0xffffffffffffffd8);
  iVar1 = CVmUndo::add_new_record_ptr_key
                    ((CVmUndo *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (vm_obj_id_t)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffe0.ptr,
                     in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    free(in_RDX);
  }
  return;
}

Assistant:

void CVmObjDict::add_undo_rec(VMG_ vm_obj_id_t self, dict_undo_rec *rec)
{
    vm_val_t val;

    /* add the record with an empty value */
    val.set_empty();
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec, &val))
    {
        /* 
         *   we didn't add an undo record, so our extra undo information
         *   isn't actually going to be stored in the undo system - hence
         *   we must delete our extra information 
         */
        t3free(rec);
    }
}